

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::Table_NoThrowSwappable_Test::~Table_NoThrowSwappable_Test
          (Table_NoThrowSwappable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, NoThrowSwappable) {
  ASSERT_TRUE(
      priv::IsNoThrowSwappable<phmap::Hash<std::string_view>>());
  ASSERT_TRUE(priv::IsNoThrowSwappable<
              std::equal_to<std::string_view>>());
  ASSERT_TRUE(priv::IsNoThrowSwappable<std::allocator<int>>());
  EXPECT_TRUE(priv::IsNoThrowSwappable<StringTable>());
}